

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::addTable
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *this,Name param_1,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2,ImportNames *param_3,Type ttype,
          Index pos)

{
  bool bVar1;
  pointer pTVar2;
  Ok local_9d [20];
  allocator<char> local_89;
  string local_88;
  Err local_68;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *local_48;
  value_type *t;
  ImportNames *param_3_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2_local;
  ParseModuleTypesCtx *this_local;
  Type ttype_local;
  Name param_1_local;
  
  ttype_local.id = param_1.super_IString.str._M_len;
  this_local = (ParseModuleTypesCtx *)ttype.id;
  t = (value_type *)param_3;
  param_3_local = (ImportNames *)param_2;
  param_2_local = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)this;
  local_48 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::operator[](&this->wasm->tables,(ulong)this->index);
  bVar1 = wasm::Type::isRef((Type *)&this_local);
  if (bVar1) {
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(local_48);
    (pTVar2->type).id = (uintptr_t)this_local;
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,local_9d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"expected reference type",&local_89);
    Lexer::err(&local_68,&this->in,(ulong)pos,&local_88);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_68);
    wasm::Err::~Err(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> addTable(
    Name, const std::vector<Name>&, ImportNames*, Type ttype, Index pos) {
    auto& t = wasm.tables[index];
    if (!ttype.isRef()) {
      return in.err(pos, "expected reference type");
    }
    t->type = ttype;
    return Ok{};
  }